

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_ints
          (TensorValue *this,TensorValue_RepeatedInts *ints)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TensorValue_RepeatedInts *ints_local;
  TensorValue *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (ints != (TensorValue_RepeatedInts *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>::GetOwningArena
                   (ints);
    message_arena = (Arena *)ints;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                              (message_arena_00,ints,submessage_arena_00);
    }
    set_has_ints(this);
    (this->value_).floats_ = (TensorValue_RepeatedFloats *)message_arena;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_ints(::CoreML::Specification::MILSpec::TensorValue_RepeatedInts* ints) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (ints) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedInts>::GetOwningArena(ints);
    if (message_arena != submessage_arena) {
      ints = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, ints, submessage_arena);
    }
    set_has_ints();
    value_.ints_ = ints;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.ints)
}